

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::clear_to_size(dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *this,size_type new_num_buckets)

{
  void *pvVar1;
  pointer pcVar2;
  pointer ptr;
  ulong uVar3;
  size_type sVar4;
  long lVar5;
  float fVar6;
  
  ptr = this->table;
  if (ptr == (pointer)0x0) {
    ptr = (pointer)malloc(new_num_buckets << 5);
  }
  else {
    sVar4 = this->num_buckets;
    if (sVar4 == 0) {
      sVar4 = 0;
    }
    else {
      lVar5 = 0x10;
      do {
        pvVar1 = *(void **)((long)this->table + lVar5 + -0x10);
        if ((void *)((long)&(this->table->_M_dataplus)._M_p + lVar5) != pvVar1) {
          operator_delete(pvVar1);
        }
        lVar5 = lVar5 + 0x20;
        sVar4 = sVar4 - 1;
      } while (sVar4 != 0);
      sVar4 = this->num_buckets;
      ptr = this->table;
    }
    if (sVar4 == new_num_buckets) goto LAB_00616b73;
    ptr = alloc_impl<google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::realloc_or_die((alloc_impl<google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&this->field_0x98,ptr,new_num_buckets);
  }
  this->table = ptr;
LAB_00616b73:
  sVar4 = new_num_buckets;
  if (new_num_buckets != 0) {
    do {
      (ptr->_M_dataplus)._M_p = (pointer)&ptr->field_2;
      pcVar2 = (this->key_info).empty_key._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)ptr,pcVar2,pcVar2 + (this->key_info).empty_key._M_string_length);
      ptr = ptr + 1;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
  }
  this->num_deleted = 0;
  this->num_elements = 0;
  this->num_buckets = new_num_buckets;
  fVar6 = (this->settings).
          super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
          .enlarge_factor_ * (float)new_num_buckets;
  uVar3 = (ulong)fVar6;
  (this->settings).
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .enlarge_threshold_ = (long)(fVar6 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
  fVar6 = (float)new_num_buckets *
          (this->settings).
          super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
          .shrink_factor_;
  uVar3 = (ulong)fVar6;
  (this->settings).
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .shrink_threshold_ = (long)(fVar6 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
  (this->settings).
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .consider_shrink_ = false;
  return;
}

Assistant:

void clear_to_size(size_type new_num_buckets) {
    if (!table) {
      table = val_info.allocate(new_num_buckets);
    } else {
      destroy_buckets(0, num_buckets);
      if (new_num_buckets != num_buckets) {  // resize, if necessary
        typedef std::integral_constant<
            bool, std::is_same<value_alloc_type,
                               libc_allocator_with_realloc<value_type>>::value>
            realloc_ok;
        resize_table(num_buckets, new_num_buckets, realloc_ok());
      }
    }
    assert(table);
    fill_range_with_empty(table, new_num_buckets);
    num_elements = 0;
    num_deleted = 0;
    num_buckets = new_num_buckets;  // our new size
    settings.reset_thresholds(bucket_count());
  }